

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_initialize_rd_consts(AV1_COMP *cpi)

{
  FRAME_TYPE frame_type;
  FRAME_UPDATE_TYPE update_type;
  char cVar1;
  byte bVar2;
  uint8_t uVar3;
  int frames_since_key;
  aom_bit_depth_t aVar4;
  int use_fixed_qp_offsets;
  INTERNAL_COST_UPDATE_TYPE IVar5;
  INTERNAL_COST_UPDATE_TYPE cost_upd_level;
  AV1_PRIMARY *pAVar6;
  ulong uVar7;
  INTERNAL_COST_UPDATE_TYPE cost_upd_level_00;
  AV1_COMMON *cm_00;
  int16_t iVar8;
  int is_stat_consumption_stage;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  IntraBCMVCosts *dv_costs;
  INTERNAL_COST_UPDATE_TYPE IVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  AV1_COMMON *cm;
  long lVar20;
  double dVar21;
  double dVar22;
  byte local_58 [16];
  AV1_COMMON *local_48;
  int (*local_40) [22] [169];
  segmentation *local_38;
  
  iVar13 = (cpi->sf).rt_sf.use_nonrd_pick_mode;
  frames_since_key = (cpi->rc).frames_since_key;
  pAVar6 = cpi->ppi;
  iVar12 = (pAVar6->p_rc).gfu_boost;
  iVar9 = 0xf;
  if (iVar12 < 0x640) {
    iVar9 = iVar12 / 100;
  }
  iVar12 = (pAVar6->gf_group).layer_depth[cpi->gf_frame_index];
  iVar15 = 6;
  if (iVar12 < 6) {
    iVar15 = iVar12;
  }
  frame_type = (cpi->common).current_frame.frame_type;
  iVar12 = (cpi->common).quant_params.y_dc_delta_q;
  iVar11 = (cpi->common).quant_params.base_qindex;
  aVar4 = ((cpi->common).seq_params)->bit_depth;
  update_type = (pAVar6->gf_group).update_type[cpi->gf_frame_index];
  use_fixed_qp_offsets = (cpi->oxcf).q_cfg.use_fixed_qp_offsets;
  is_stat_consumption_stage = ::is_stat_consumption_stage(cpi);
  iVar9 = av1_compute_rd_mult(iVar12 + iVar11,aVar4,update_type,iVar15,iVar9,frame_type,
                              use_fixed_qp_offsets,is_stat_consumption_stage,
                              (cpi->oxcf).tune_cfg.tuning);
  (cpi->rd).RDMULT = iVar9;
  iVar12 = 1;
  if (1 < iVar9 >> 6) {
    iVar12 = iVar9 >> 6;
  }
  (cpi->td).mb.errorperbit = iVar12;
  iVar12 = (cpi->sf).rt_sf.use_nonrd_pick_mode;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  if (iVar12 == 0) {
    uVar18 = 0xa9;
  }
  else {
    lVar19 = 0;
    for (lVar17 = 0; uVar18 = (uint)lVar19, lVar17 != 4; lVar17 = lVar17 + 1) {
      cVar1 = real_time_ref_combos[lVar17][0];
      lVar19 = (long)(int)uVar18;
      lVar20 = 0;
      if ((long)cVar1 == 0) {
        for (; lVar20 != 4; lVar20 = lVar20 + 1) {
          iVar9 = mode_offset(""[lVar20]);
          local_58[lVar20 + lVar19] = mode_idx[0][iVar9];
        }
      }
      else {
        for (; lVar20 != 4; lVar20 = lVar20 + 1) {
          iVar9 = mode_offset("\r\x0e\x0f\x10"[lVar20]);
          local_58[lVar20 + lVar19] = mode_idx[cVar1][iVar9];
        }
      }
      lVar19 = lVar19 + 4;
    }
  }
  local_48 = &cpi->common;
  local_38 = &(cpi->common).seg;
  if ((int)uVar18 < 1) {
    uVar18 = 0;
  }
  local_40 = (cpi->rd).threshes;
  for (lVar17 = 0; cm_00 = local_48, lVar17 != 8; lVar17 = lVar17 + 1) {
    iVar9 = av1_get_qindex(local_38,(int)lVar17,(cpi->common).quant_params.base_qindex);
    iVar9 = iVar9 + (cpi->common).quant_params.y_dc_delta_q;
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    aVar4 = ((cpi->common).seq_params)->bit_depth;
    dVar21 = 0.25;
    if (aVar4 == AOM_BITS_8) {
LAB_001e73bb:
      iVar8 = av1_dc_quant_QTX(iVar9,0,aVar4);
      dVar22 = pow((double)(int)iVar8 * dVar21,1.25);
      iVar15 = 8;
      if (8 < (int)(dVar22 * 5.12)) {
        dVar21 = pow((double)(int)iVar8 * dVar21,1.25);
        iVar15 = (int)(dVar21 * 5.12);
      }
    }
    else {
      if (aVar4 == AOM_BITS_12) {
        dVar21 = 0.015625;
        goto LAB_001e73bb;
      }
      iVar15 = -1;
      if (aVar4 == AOM_BITS_10) {
        dVar21 = 0.0625;
        goto LAB_001e73bb;
      }
    }
    for (lVar19 = 0; lVar19 != 0x16; lVar19 = lVar19 + 1) {
      bVar2 = "\x02\x03\x03\x04\x06\x06\b\f\f\x10\x18\x18 00@\x04\x04\b\b\x10\x10"[lVar19];
      for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
        uVar10 = (uint)uVar16;
        if (iVar12 != 0) {
          uVar10 = (uint)local_58[uVar16];
        }
        iVar9 = (cpi->rd).thresh_mult[uVar10];
        iVar11 = 0x7fffffff;
        if (iVar9 < (int)(0x7fffffff / (long)(int)((uint)bVar2 * iVar15))) {
          iVar11 = (int)(iVar9 * (uint)bVar2 * iVar15) / 4;
        }
        local_40[lVar17][lVar19][uVar10] = iVar11;
      }
    }
  }
  uVar16._0_4_ = (cpi->oxcf).cost_upd_freq.mv;
  uVar16._4_4_ = (cpi->oxcf).cost_upd_freq.dv;
  IVar5 = (cpi->sf).inter_sf.mv_cost_upd_level;
  cost_upd_level_00 =
       *(INTERNAL_COST_UPDATE_TYPE *)
        (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
        (uVar16 & 0xffffffff) * 4);
  if (IVar5 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar16 & 0xffffffff) * 4)) {
    cost_upd_level_00 = IVar5;
  }
  uVar7._0_4_ = (cpi->oxcf).cost_upd_freq.coeff;
  uVar7._4_4_ = (cpi->oxcf).cost_upd_freq.mode;
  (cpi->sf).inter_sf.mv_cost_upd_level = cost_upd_level_00;
  IVar5 = (cpi->sf).inter_sf.coeff_cost_upd_level;
  cost_upd_level =
       *(INTERNAL_COST_UPDATE_TYPE *)
        (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
        (uVar7 & 0xffffffff) * 4);
  if (IVar5 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar7 & 0xffffffff) * 4)) {
    cost_upd_level = IVar5;
  }
  (cpi->sf).inter_sf.coeff_cost_upd_level = cost_upd_level;
  IVar5 = (cpi->sf).inter_sf.mode_cost_upd_level;
  IVar14 = *(INTERNAL_COST_UPDATE_TYPE *)
            (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
            (uVar7 >> 0x20) * 4);
  if (IVar5 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar7 >> 0x20) * 4)) {
    IVar14 = IVar5;
  }
  (cpi->sf).inter_sf.mode_cost_upd_level = IVar14;
  IVar5 = (cpi->sf).intra_sf.dv_cost_upd_level;
  IVar14 = *(INTERNAL_COST_UPDATE_TYPE *)
            (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
            (uVar16 >> 0x20) * 4);
  if (IVar5 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar16 >> 0x20) * 4)) {
    IVar14 = IVar5;
  }
  (cpi->sf).intra_sf.dv_cost_upd_level = IVar14;
  iVar12 = is_frame_level_cost_upd_freq_set(local_48,cost_upd_level_00,iVar13,frames_since_key);
  if (iVar12 != 0) {
    av1_fill_mv_costs(&((cpi->common).fc)->nmvc,
                      (uint)(cpi->common).features.cur_frame_force_integer_mv,
                      (uint)(cpi->common).features.allow_high_precision_mv,(cpi->td).mb.mv_costs);
    cost_upd_level = (cpi->sf).inter_sf.coeff_cost_upd_level;
  }
  iVar12 = is_frame_level_cost_upd_freq_set(cm_00,cost_upd_level,iVar13,frames_since_key);
  if (iVar12 != 0) {
    av1_fill_coeff_costs
              (&(cpi->td).mb.coeff_costs,(cpi->common).fc,
               (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
  }
  if ((cpi->sf).rt_sf.frame_level_mode_cost_update == true) {
    uVar3 = (cpi->oxcf).algo_cfg.cdf_update_mode;
    if (uVar3 != '\x01') {
      if ((uVar3 == '\x02') && (cpi->frames_since_last_update == 1)) goto LAB_001e7665;
      goto LAB_001e764e;
    }
    iVar12 = (cpi->svc).number_temporal_layers;
    if (iVar12 == 1 && (cpi->svc).number_spatial_layers == 1) {
      if (((((cm_00->current_frame).frame_type & 0xfd) != 0) &&
          ((((iVar12 = (cpi->resize_pending_params).width, iVar12 == 0 ||
             (iVar9 = (cpi->resize_pending_params).height, iVar9 == 0)) ||
            (((cpi->common).width == iVar12 && ((cpi->common).height == iVar9)))) &&
           ((((cpi->rc).high_source_sad == 0 && (9 < (cpi->rc).frames_since_key)) &&
            (9 < cpi->cyclic_refresh->counter_encode_maxq_scene_change)))))) &&
         (((cpi->common).current_frame.frame_number & 7) != 0)) goto LAB_001e764e;
    }
    else if ((iVar12 < 2) || ((cpi->svc).temporal_layer_id == iVar12 + -1)) goto LAB_001e764e;
  }
  else {
LAB_001e764e:
    iVar13 = is_frame_level_cost_upd_freq_set
                       (cm_00,(cpi->sf).inter_sf.mode_cost_upd_level,iVar13,frames_since_key);
    if (iVar13 == 0) goto LAB_001e767b;
  }
LAB_001e7665:
  av1_fill_mode_rates(cm_00,&(cpi->td).mb.mode_costs,(cpi->common).fc);
LAB_001e767b:
  if ((((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) &&
      (((cm_00->current_frame).frame_type & 0xfd) == 0)) &&
     (((cpi->common).features.allow_screen_content_tools == true &&
      ((((cpi->common).features.allow_intrabc != false && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS))
       && (cpi->compressor_stage != '\x01')))))) {
    if ((cpi->td).dv_costs_alloc == (IntraBCMVCosts *)0x0) {
      dv_costs = (IntraBCMVCosts *)aom_malloc(0x40018);
      (cpi->td).dv_costs_alloc = dv_costs;
      if (dv_costs == (IntraBCMVCosts *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->td.dv_costs_alloc");
        dv_costs = (cpi->td).dv_costs_alloc;
      }
      (cpi->td).mb.dv_costs = dv_costs;
    }
    else {
      dv_costs = (cpi->td).mb.dv_costs;
    }
    av1_fill_dv_costs(&((cpi->common).fc)->ndvc,dv_costs);
    return;
  }
  return;
}

Assistant:

void av1_initialize_rd_consts(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &cpi->td.mb;
  SPEED_FEATURES *const sf = &cpi->sf;
  RD_OPT *const rd = &cpi->rd;
  int use_nonrd_pick_mode = cpi->sf.rt_sf.use_nonrd_pick_mode;
  int frames_since_key = cpi->rc.frames_since_key;

  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  const int qindex_rdmult =
      cm->quant_params.base_qindex + cm->quant_params.y_dc_delta_q;
  rd->RDMULT = av1_compute_rd_mult(
      qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);
#if CONFIG_RD_COMMAND
  if (cpi->oxcf.pass == 2) {
    const RD_COMMAND *rd_command = &cpi->rd_command;
    if (rd_command->option_ls[rd_command->frame_index] ==
        RD_OPTION_SET_Q_RDMULT) {
      rd->RDMULT = rd_command->rdmult_ls[rd_command->frame_index];
    }
  }
#endif  // CONFIG_RD_COMMAND

  av1_set_error_per_bit(&x->errorperbit, rd->RDMULT);

  set_block_thresholds(cm, rd, cpi->sf.rt_sf.use_nonrd_pick_mode);

  populate_unified_cost_update_freq(cpi->oxcf.cost_upd_freq, sf);
  const INTER_MODE_SPEED_FEATURES *const inter_sf = &cpi->sf.inter_sf;
  // Frame level mv cost update
  if (is_frame_level_cost_upd_freq_set(cm, inter_sf->mv_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_mv_costs(&cm->fc->nmvc, cm->features.cur_frame_force_integer_mv,
                      cm->features.allow_high_precision_mv, x->mv_costs);

  // Frame level coefficient cost update
  if (is_frame_level_cost_upd_freq_set(cm, inter_sf->coeff_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_coeff_costs(&x->coeff_costs, cm->fc, av1_num_planes(cm));

  // Frame level mode cost update
  if (should_force_mode_cost_update(cpi) ||
      is_frame_level_cost_upd_freq_set(cm, inter_sf->mode_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_mode_rates(cm, &x->mode_costs, cm->fc);

  // Frame level dv cost update
  if (av1_need_dv_costs(cpi)) {
    if (cpi->td.dv_costs_alloc == NULL) {
      CHECK_MEM_ERROR(
          cm, cpi->td.dv_costs_alloc,
          (IntraBCMVCosts *)aom_malloc(sizeof(*cpi->td.dv_costs_alloc)));
      cpi->td.mb.dv_costs = cpi->td.dv_costs_alloc;
    }
    av1_fill_dv_costs(&cm->fc->ndvc, x->dv_costs);
  }
}